

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O2

bool __thiscall Rml::DataViewStyle::Update(DataViewStyle *this,DataModel *model)

{
  bool bVar1;
  Element *element;
  DataExpression *this_00;
  Property *this_01;
  String *name;
  String value;
  Variant variant;
  DataExpressionInterface expr_interface;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_c8;
  Variant local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  DataExpressionInterface local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  Variant::Variant(&local_a8);
  element = DataView::GetElement((DataView *)this);
  DataExpressionInterface::DataExpressionInterface(&local_60,model,element,(Event *)0x0);
  if (element != (Element *)0x0) {
    this_00 = DataViewCommon::GetExpression(&this->super_DataViewCommon);
    bVar1 = DataExpression::Run(this_00,&local_60,&local_a8);
    if (bVar1) {
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      local_80._M_string_length = 0;
      local_80.field_2._M_local_buf[0] = '\0';
      Variant::Get<std::__cxx11::string>(&bStack_c8,&local_a8,&local_80);
      name = &(this->super_DataViewCommon).modifier;
      ::std::__cxx11::string::~string((string *)&local_80);
      this_01 = Element::GetLocalProperty(element,name);
      if (this_01 == (Property *)0x0) {
LAB_0026eb2e:
        bVar1 = true;
        Element::SetProperty(element,name,&bStack_c8);
      }
      else {
        Property::Get<std::__cxx11::string>(&local_48,this_01);
        bVar1 = ::std::operator!=(&local_48,&bStack_c8);
        ::std::__cxx11::string::~string((string *)&local_48);
        if (bVar1) goto LAB_0026eb2e;
        bVar1 = false;
      }
      ::std::__cxx11::string::~string((string *)&bStack_c8);
      goto LAB_0026eb4f;
    }
  }
  bVar1 = false;
LAB_0026eb4f:
  Variant::~Variant(&local_a8);
  return bVar1;
}

Assistant:

bool DataViewStyle::Update(DataModel& model)
{
	const String& property_name = GetModifier();
	bool result = false;
	Variant variant;
	Element* element = GetElement();
	DataExpressionInterface expr_interface(&model, element);

	if (element && GetExpression().Run(expr_interface, variant))
	{
		const String value = variant.Get<String>();
		const Property* p = element->GetLocalProperty(property_name);
		if (!p || p->Get<String>() != value)
		{
			element->SetProperty(property_name, value);
			result = true;
		}
	}
	return result;
}